

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::ShapeGeometry::ShapeGeometry
          (ShapeGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  Scope *pSVar1;
  Element *pEVar2;
  allocator local_f9;
  string local_f8;
  Element *local_d8;
  Element *Vertices;
  string local_c8;
  Element *local_a8;
  Element *Normals;
  string local_98;
  Element *local_78;
  Element *Indexes;
  string local_68;
  Scope *local_38;
  Scope *sc;
  Document *doc_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  ShapeGeometry *this_local;
  
  sc = (Scope *)doc;
  doc_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__ShapeGeometry_0037b6a0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_vertices);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->m_normals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_indices);
  pSVar1 = Element::Compound((Element *)name_local);
  local_38 = pSVar1;
  if (pSVar1 == (Scope *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,
               "failed to read Geometry object (class: Shape), no data scope found",
               (allocator *)((long)&Indexes + 7));
    Util::DOMError(&local_68,(Element *)0x0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"Indexes",(allocator *)((long)&Normals + 7));
  pEVar2 = GetRequiredElement(pSVar1,&local_98,(Element *)name_local);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Normals + 7));
  pSVar1 = local_38;
  local_78 = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"Normals",(allocator *)((long)&Vertices + 7));
  pEVar2 = GetRequiredElement(pSVar1,&local_c8,(Element *)name_local);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Vertices + 7));
  pSVar1 = local_38;
  local_a8 = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"Vertices",&local_f9);
  pEVar2 = GetRequiredElement(pSVar1,&local_f8,(Element *)name_local);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_d8 = pEVar2;
  ParseVectorDataArray(&this->m_indices,local_78);
  ParseVectorDataArray(&this->m_vertices,local_d8);
  ParseVectorDataArray(&this->m_normals,local_a8);
  return;
}

Assistant:

ShapeGeometry::ShapeGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element, name, doc) {
    const Scope *sc = element.Compound();
    if (nullptr == sc) {
        DOMError("failed to read Geometry object (class: Shape), no data scope found");
    }
    const Element& Indexes = GetRequiredElement(*sc, "Indexes", &element);
    const Element& Normals = GetRequiredElement(*sc, "Normals", &element);
    const Element& Vertices = GetRequiredElement(*sc, "Vertices", &element);
    ParseVectorDataArray(m_indices, Indexes);
    ParseVectorDataArray(m_vertices, Vertices);
    ParseVectorDataArray(m_normals, Normals);
}